

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O1

void __thiscall
OpenNN::NeuralNetwork::train(NeuralNetwork *this,int epochs,MatrixXd *inputs,MatrixXd *targets)

{
  double *pdVar1;
  pointer ppMVar2;
  long lVar3;
  uint uVar4;
  Layer *pLVar5;
  DenseStorage<double,__1,__1,__1,_0> *pDVar6;
  ostream *poVar7;
  long *plVar8;
  char *__function;
  int iVar9;
  ulong uVar10;
  long lVar11;
  MatrixXd delta_weights_transposed;
  MatrixXd output;
  MatrixXd teste;
  MatrixXd current_values;
  MatrixXd target;
  MatrixXd current_weights;
  MatrixXd error;
  MatrixXd gradients;
  MatrixXd input;
  MatrixXd delta_weights;
  assign_op<double,_double> local_1cd;
  uint local_1cc;
  long local_1c8;
  Matrix<double,__1,__1,_0,__1,__1> local_1c0;
  DenseStorage<double,__1,__1,__1,_0> local_1a8;
  MatrixXd *local_190;
  long local_188;
  undefined8 local_180;
  undefined8 local_178;
  DenseStorage<double,__1,__1,__1,_0> local_170;
  DenseStorage<double,__1,__1,__1,_0> local_158;
  DenseStorage<double,__1,__1,__1,_0> local_140;
  ulong local_128;
  MatrixXd *local_120;
  MatrixXd *local_118;
  long local_110;
  DenseStorage<double,__1,__1,__1,_0> local_108;
  void *local_f0;
  DenseStorage<double,__1,__1,__1,_0> *local_e8;
  long local_e0;
  void *local_d8;
  DenseStorage<double,__1,__1,__1,_0> *local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_c0;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_90;
  void *local_78 [3];
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  local_1cc = epochs;
  if (((epochs == 0) ||
      ((inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
       == 0 || (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows == 0)) ||
     ((targets->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
      == 0 || (targets->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows == 0)) {
LAB_00105252:
    poVar7 = std::operator<<((ostream *)&std::cerr,"Missing train data!");
    std::endl<char,std::char_traits<char>>(poVar7);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/M4urici0GM[P]Perceptron/src/NeuralNetwork/NeuralNetwork.cpp"
                  ,0x5c,"void OpenNN::NeuralNetwork::train(int, Eigen::MatrixXd, Eigen::MatrixXd)");
  }
  if (0 < epochs) {
    local_128 = 0;
    local_120 = inputs;
    local_118 = targets;
    do {
      if (0 < (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows) {
        lVar11 = 0;
        local_1c8 = 0;
        do {
          lVar3 = local_1c8;
          pdVar1 = (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          local_1a8.m_cols =
               (inputs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
          local_1a8.m_data = (double *)((long)pdVar1 + lVar11);
          if (local_1a8.m_cols < 0 && pdVar1 != (double *)0x0) {
LAB_001051a3:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                         );
          }
          local_188 = local_1c8;
          local_180 = 0;
          local_178 = 1;
          local_190 = inputs;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a8,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)&local_1a8);
          pdVar1 = (local_118->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          local_1a8.m_cols =
               (local_118->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_cols;
          local_1a8.m_data = (double *)((long)pdVar1 + lVar11);
          local_110 = lVar11;
          if (local_1a8.m_cols < 0 && pdVar1 != (double *)0x0) goto LAB_001051a3;
          local_190 = local_118;
          local_188 = lVar3;
          local_180 = 0;
          local_178 = 1;
          if ((local_118->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows <= lVar3) {
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                         );
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_140,
                     (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)&local_1a8);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_48,&local_a8);
          predict((MatrixXd *)&local_1a8,this,(MatrixXd *)&local_48);
          free(local_48.m_data);
          local_158.m_rows = (Index)&local_140;
          local_158.m_data = (double *)&local_1a8;
          if ((local_1a8.m_rows != local_140.m_rows) || (local_1a8.m_cols != local_140.m_cols)) {
LAB_0010518c:
            __function = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
            ;
LAB_001051d7:
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,__function);
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&local_158);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_c0,&local_1a8);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_60,&local_140);
          calculate_error(this,(MatrixXd *)&local_c0,(MatrixXd *)&local_60);
          free(local_60.m_data);
          free(local_c0.m_data);
          iVar9 = (int)((ulong)((long)(this->network_layers).
                                      super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->network_layers).
                                     super__Vector_base<OpenNN::Layer_*,_std::allocator<OpenNN::Layer_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          pLVar5 = get_layer(this,iVar9 + -1);
          pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)Layer::to_matrix_derivated(pLVar5);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_158,pDVar6);
          local_170.m_data = (double *)&local_f0;
          local_170.m_rows = (Index)&local_158;
          if ((local_e8 != (DenseStorage<double,__1,__1,__1,_0> *)local_158.m_rows) ||
             (local_e0 != local_158.m_cols)) {
            __function = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
            ;
            goto LAB_001051d7;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)&local_170);
          iVar9 = iVar9 + -2;
          pLVar5 = get_layer(this,iVar9);
          pDVar6 = (DenseStorage<double,__1,__1,__1,_0> *)Layer::to_matrix_activated(pLVar5);
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_170,pDVar6);
          if (local_d0 != (DenseStorage<double,__1,__1,__1,_0> *)local_170.m_rows)
          goto LAB_00105222;
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)&local_d8;
          local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = (Index)&local_170;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_78,
                     (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                      *)&local_1c0);
          local_108.m_data = (double *)local_78;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c0,
                     (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                     &local_108);
          uVar10 = (ulong)iVar9;
          ppMVar2 = (this->weight_matrices).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->weight_matrices).
                            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3) <=
              uVar10) {
LAB_00105211:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
LAB_00105222:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                          "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                         );
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                    (&local_108,(DenseStorage<double,__1,__1,__1,_0> *)ppMVar2[uVar10]);
          local_90.m_rhs = &local_1c0;
          local_90.m_lhs = (LhsNested)&local_108;
          if ((local_108.m_rows !=
               local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) ||
             (local_108.m_cols !=
              local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) goto LAB_0010518c;
          ppMVar2 = (this->weight_matrices).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->weight_matrices).
                            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3) <=
              uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
            goto LAB_00105211;
          }
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                    (ppMVar2[uVar10],&local_90,&local_1cd);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Current Weights: ",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          poVar7 = (ostream *)std::ostream::flush();
          poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                            &local_108);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Delta Weights: ",0xf);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          poVar7 = (ostream *)std::ostream::flush();
          poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                            &local_1c0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Updated Weights: ",0x11);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          poVar7 = (ostream *)std::ostream::flush();
          ppMVar2 = (this->weight_matrices).
                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->weight_matrices).
                            super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2 >> 3) <=
              uVar10) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar10);
            goto LAB_00105252;
          }
          poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                            ppMVar2[uVar10]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"=====================================",0x25);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
          std::ostream::put('p');
          plVar8 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
          std::ostream::put((char)plVar8);
          std::ostream::flush();
          free(local_108.m_data);
          free(local_1c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_78[0]);
          free(local_170.m_data);
          free(local_d8);
          free(local_158.m_data);
          free(local_f0);
          free(local_1a8.m_data);
          free(local_140.m_data);
          free(local_a8.m_data);
          local_1c8 = local_1c8 + 1;
          lVar11 = local_110 + 8;
          inputs = local_120;
        } while (local_1c8 <
                 (local_120->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_rows);
      }
      uVar4 = (int)local_128 + 1;
      local_128 = (ulong)uVar4;
    } while (uVar4 != local_1cc);
  }
  return;
}

Assistant:

void OpenNN::NeuralNetwork::train(int epochs, Eigen::MatrixXd inputs, Eigen::MatrixXd targets)
{
    if (epochs == 0 || inputs.size() == 0 || targets.size() == 0)
    {
        std::cerr << "Missing train data!" << std::endl;
        assert(false);
    }

    for (int epoch = 0; epoch < epochs; epoch++)
    {
        for (int i = 0; i < inputs.rows(); i++)
        {
            Eigen::MatrixXd input = inputs.row(i).matrix();
            Eigen::MatrixXd target = targets.row(i).matrix();

            Eigen::MatrixXd output = this->predict(input);

            Eigen::MatrixXd error = (output - target);

            this->calculate_error(output, target);

            int output_layer_index = (this->network_layers.size() - 1);
            int first_hidden_layer_index = (output_layer_index - 1);

            /**
             * Output to the firt hidden
             * ----------------------------------
             * */
            Layer* current_layer = this->get_layer(output_layer_index);
            Eigen::MatrixXd current_values = *current_layer->to_matrix_derivated();

            //Calculate the gradient of current layer
            Eigen::MatrixXd gradients = error.cwiseProduct(current_values);
            // gradients *= this->learning_rate;

            /**
             * Multiply the transposed version of the gradient matrix by the output of the previous layer 
             * and transpose it
             * */
            auto teste = *this->get_layer(first_hidden_layer_index)->to_matrix_activated();
            

            Eigen::MatrixXd delta_weights = gradients.transpose() * teste;
            Eigen::MatrixXd delta_weights_transposed = delta_weights.transpose();

            /**
             * Get the weights between the previous layer and the current one
             * */
            Eigen::MatrixXd current_weights = *this->weight_matrices.at(first_hidden_layer_index);

            /**
             * Subtract the current weights by the delta weight
             * */


            /**
             * Update the weights with the new one
             * */
            *this->weight_matrices.at(first_hidden_layer_index) = (current_weights - delta_weights_transposed);


            std::cout << "Current Weights: " << std::endl << current_weights << std::endl;
            std::cout << "Delta Weights: " << std::endl << delta_weights_transposed << std::endl;
            std::cout << "Updated Weights: " << std::endl << *this->weight_matrices.at(first_hidden_layer_index) << std::endl;
            std::cout << "=====================================" << std::endl << std::endl;
        }   
    }
}